

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *this,size_t MinSize)

{
  undefined4 uVar1;
  move_iterator<llvm::DWARFDebugNames::NameIndex_*> __first;
  NameIndex *S;
  SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *__ptr;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  NameIndex *__result;
  ulong uVar10;
  undefined8 *extraout_RDX;
  undefined8 *__size;
  undefined8 *puVar11;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar9 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar10 = uVar9 >> 1 | uVar9;
  uVar10 = uVar10 >> 2 | uVar10;
  uVar10 = uVar10 >> 4 | uVar10;
  uVar10 = uVar10 >> 8 | uVar10;
  uVar9 = (uVar9 >> 0x20 | uVar10 >> 0x10 | uVar10) + 1;
  if (uVar9 <= MinSize) {
    uVar9 = MinSize;
  }
  if (0xfffffffe < uVar9) {
    uVar9 = 0xffffffff;
  }
  __size = (undefined8 *)(uVar9 * 0x98);
  __result = (NameIndex *)malloc((size_t)__size);
  if (__result != (NameIndex *)0x0) {
    __first._M_current =
         (NameIndex *)
         (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
         super_SmallVectorBase.BeginX;
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<llvm::DWARFDebugNames::NameIndex*>,llvm::DWARFDebugNames::NameIndex*>
              (__first,__first._M_current +
                       (this->
                       super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
                       super_SmallVectorBase.Size,__result);
    S = (NameIndex *)
        (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
        super_SmallVectorBase.BeginX;
    destroy_range(S,S + (this->
                        super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
                        super_SmallVectorBase.Size);
    __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *)
            (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
            super_SmallVectorBase.BeginX;
    if (__ptr != this + 1) {
      free(__ptr);
    }
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
    super_SmallVectorBase.BeginX = __result;
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
    super_SmallVectorBase.Capacity = (uint)uVar9;
    return;
  }
  SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,false>::grow();
  puVar11 = extraout_RDX;
  for (; __size != (undefined8 *)MinSize; __size = __size + 0x13) {
    *(undefined4 *)(puVar11 + 2) = 0;
    *puVar11 = 0;
    puVar11[1] = 0;
    *puVar11 = *__size;
    *__size = 0;
    *(undefined4 *)(puVar11 + 1) = *(undefined4 *)(__size + 1);
    *(undefined4 *)(__size + 1) = 0;
    uVar1 = *(undefined4 *)((long)puVar11 + 0xc);
    *(undefined4 *)((long)puVar11 + 0xc) = *(undefined4 *)((long)__size + 0xc);
    *(undefined4 *)((long)__size + 0xc) = uVar1;
    uVar1 = *(undefined4 *)(puVar11 + 2);
    *(undefined4 *)(puVar11 + 2) = *(undefined4 *)(__size + 2);
    *(undefined4 *)(__size + 2) = uVar1;
    *(undefined4 *)(puVar11 + 7) = *(undefined4 *)(__size + 7);
    uVar2 = __size[3];
    uVar3 = __size[4];
    uVar4 = __size[6];
    puVar11[5] = __size[5];
    puVar11[6] = uVar4;
    puVar11[3] = uVar2;
    puVar11[4] = uVar3;
    SmallVector<char,_8U>::SmallVector
              ((SmallVector<char,_8U> *)(puVar11 + 8),(SmallVector<char,_8U> *)(__size + 8));
    uVar2 = __size[0xb];
    uVar3 = __size[0xc];
    uVar4 = __size[0xd];
    uVar5 = __size[0xe];
    uVar6 = __size[0xf];
    uVar7 = __size[0x10];
    uVar8 = __size[0x12];
    puVar11[0x11] = __size[0x11];
    puVar11[0x12] = uVar8;
    puVar11[0xf] = uVar6;
    puVar11[0x10] = uVar7;
    puVar11[0xd] = uVar4;
    puVar11[0xe] = uVar5;
    puVar11[0xb] = uVar2;
    puVar11[0xc] = uVar3;
    puVar11 = puVar11 + 0x13;
  }
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}